

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataset.cpp
# Opt level: O0

void __thiscall DataSet::load(DataSet *this,string *filepath,ReadInfo *info)

{
  uint uVar1;
  byte bVar2;
  bool bVar3;
  _Ios_Openmode _Var4;
  istream *piVar5;
  ulong uVar6;
  vector<double,_std::allocator<double>_> *this_00;
  Shape SVar7;
  string local_790 [32];
  undefined8 local_770;
  undefined1 local_768;
  undefined8 local_760;
  undefined1 local_758;
  undefined8 local_750;
  undefined1 local_748;
  undefined8 local_73c;
  undefined1 local_734;
  double local_730;
  stringstream local_728 [8];
  stringstream stream_2;
  stringstream local_5a0 [8];
  stringstream stream_1;
  long local_408;
  ifstream file;
  undefined1 local_200 [8];
  string token;
  string line;
  stringstream stream;
  ostream local_1b0 [380];
  undefined1 local_34 [8];
  Shape shape;
  uint n_col;
  uint n_row;
  ReadInfo *info_local;
  string *filepath_local;
  DataSet *this_local;
  
  shape.is_diogonal = false;
  shape._9_3_ = 0;
  shape.n_col = 0;
  Shape::Shape((Shape *)local_34);
  std::__cxx11::stringstream::stringstream((stringstream *)(line.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(token.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_200);
  std::ifstream::ifstream(&local_408,(string *)filepath,_S_in);
  bVar2 = std::ios::operator!((ios *)((long)&local_408 + *(long *)(local_408 + -0x18)));
  if ((bVar2 & 1) != 0) {
    std::operator<<((ostream *)&std::cout,"ERROR [loading file]: Couldn\'t open up the file!\n");
    exit(1);
  }
  if ((info->shape_skip & 1U) == 0) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&local_408,(string *)(token.field_2._M_local_buf + 8));
    _Var4 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream
              (local_5a0,(string *)(token.field_2._M_local_buf + 8),_Var4);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_5a0,(string *)local_200,',');
    local_34._0_4_ = std::__cxx11::stoi((string *)local_200,(size_t *)0x0,10);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_5a0,(string *)local_200,',');
    local_34._4_4_ = std::__cxx11::stoi((string *)local_200,(size_t *)0x0,10);
    std::__cxx11::stringstream::~stringstream(local_5a0);
  }
  if ((info->header_skip & 1U) == 0) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&local_408,(string *)(token.field_2._M_local_buf + 8));
    _Var4 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream
              (local_728,(string *)(token.field_2._M_local_buf + 8),_Var4);
    while( true ) {
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_728,(string *)local_200,',');
      bVar3 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
      if (!bVar3) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->m_labels,(value_type *)local_200);
    }
    std::__cxx11::stringstream::~stringstream(local_728);
  }
  while( true ) {
    do {
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&local_408,(string *)(token.field_2._M_local_buf + 8));
      bVar3 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
      if (!bVar3) {
        if ((local_34._0_4_ != 0) && (local_34._0_4_ != shape._8_4_)) {
          std::operator<<((ostream *)&std::cout,"WARNING [loading file]: Shape doesn\'t match!\n");
        }
        std::ifstream::close();
        std::ifstream::~ifstream(&local_408);
        std::__cxx11::string::~string((string *)local_200);
        std::__cxx11::string::~string((string *)(token.field_2._M_local_buf + 8));
        std::__cxx11::stringstream::~stringstream((stringstream *)(line.field_2._M_local_buf + 8));
        return;
      }
      uVar6 = std::__cxx11::string::empty();
    } while (((uVar6 & 1) != 0) && ((info->empty_line_skip & 1U) != 0));
    std::operator<<(local_1b0,(string *)(token.field_2._M_local_buf + 8));
    Matrix<double>::add_row(&this->m_matrix,1);
    while( true ) {
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)(line.field_2._M_local_buf + 8),(string *)local_200,',');
      bVar3 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
      uVar1 = shape.n_col;
      if (!bVar3) break;
      this_00 = Matrix<double>::operator[](&this->m_matrix,shape._8_4_);
      local_730 = std::__cxx11::stod((string *)local_200,(size_t *)0x0);
      std::vector<double,_std::allocator<double>_>::push_back(this_00,&local_730);
      shape.n_col = shape.n_col + 1;
    }
    if (((local_34._4_4_ == 0) || (bVar3 = true, local_34._4_4_ == shape.n_col)) &&
       (bVar3 = false, shape._8_4_ != 0)) {
      SVar7 = Matrix<double>::shape(&this->m_matrix);
      local_750 = SVar7._0_8_;
      local_748 = SVar7.is_diogonal;
      local_73c._4_4_ = SVar7.n_col;
      bVar3 = uVar1 != local_73c._4_4_;
      local_73c = local_750;
      local_734 = local_748;
    }
    if (bVar3) break;
    SVar7 = Matrix<double>::shape(&this->m_matrix);
    local_770 = SVar7._0_8_;
    local_768 = SVar7.is_diogonal;
    local_760._0_4_ = SVar7.n_row;
    uVar1 = (uint)local_760;
    local_760 = local_770;
    local_758 = local_768;
    Matrix<double>::set_shape(&this->m_matrix,uVar1,shape.n_col);
    shape.n_col = 0;
    shape._8_4_ = shape._8_4_ + 1;
    std::__cxx11::string::string(local_790);
    std::__cxx11::stringstream::str((string *)(line.field_2._M_local_buf + 8));
    std::__cxx11::string::~string(local_790);
    std::ios::clear((long)&line.field_2 + *(long *)(line.field_2._8_8_ + -0x18) + 8,0);
  }
  std::operator<<((ostream *)&std::cout,"ERROR [file loading]: Different dimensions!\n");
  exit(1);
}

Assistant:

void DataSet::load(const std::string& filepath, const ReadInfo& info){
    unsigned n_row=0, n_col=0;
    Shape shape;
    
    std::stringstream stream;
    std::string line, token;
    std::ifstream file(filepath);

    if(!file){
        std::cout<<"ERROR [loading file]: Couldn't open up the file!\n";
        exit(1);
    }

    if(!info.shape_skip){
        std::getline(file, line);
        std::stringstream stream(line);

        std::getline(stream, token, ',');
        shape.n_row=std::stoi(token);
        std::getline(stream, token, ',');
        shape.n_col=std::stoi(token);
    }
    if(!info.header_skip){
        std::getline(file, line);
        std::stringstream stream(line);
        while(std::getline(stream, token, ',')){
            m_labels.push_back(token);
        }
    }

    while(std::getline(file, line)){
        if(line.empty() && info.empty_line_skip) continue;

        stream<<line;
        m_matrix.add_row();
        while(std::getline(stream, token, ',')){
            m_matrix[n_row].push_back(std::stod(token));
            ++n_col;
        }

        if( (shape.n_col && shape.n_col!=n_col) || 
            (n_row && n_col!=m_matrix.shape().n_col) ){
            std::cout<<"ERROR [file loading]: Different dimensions!\n";
            exit(1);
        }

        m_matrix.set_shape(m_matrix.shape().n_row, n_col);
        n_col=0; ++n_row;
        stream.str(std::string());
        stream.clear();
    }

    if(shape.n_row && shape.n_row!=n_row){
        std::cout<<"WARNING [loading file]: Shape doesn't match!\n";
    }

    file.close();
}